

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
mxx::all2all<std::pair<int,int>>
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,mxx *this,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *msgs,comm *comm)

{
  int iVar1;
  size_type sVar2;
  const_reference this_00;
  comm *in_R8;
  size_t size;
  comm *comm_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *msgs_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *result;
  
  sVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this);
  iVar1 = mxx::comm::size((comm *)msgs);
  if ((int)sVar2 % iVar1 != 0) {
    assert_fail("(int)msgs.size() % comm.size() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/collective.hpp"
                ,0x4b2,"all2all");
  }
  sVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this);
  iVar1 = mxx::comm::size((comm *)msgs);
  this_00 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this,0)
  ;
  all2all<std::pair<int,int>>
            (__return_storage_ptr__,(mxx *)this_00,(pair<int,_int> *)(sVar2 / (ulong)(long)iVar1),
             (size_t)msgs,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> all2all(const std::vector<T>& msgs, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT((int)msgs.size() % comm.size() == 0);
    size_t size = msgs.size() / comm.size();
    std::vector<T> result = all2all(&msgs[0], size, comm);
    return result;
}